

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageDataOperator::process
          (MessageDataOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  long *in_RDX;
  
  if (message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl != (Message *)0x0) {
    std::function<void_(helics::SmallBuffer_&)>::operator()
              ((function<void_(helics::SmallBuffer_&)> *)(message + 1),
               (SmallBuffer *)(*in_RDX + 0x10));
  }
  (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageDataOperator::process(std::unique_ptr<Message> message)
{
    if (dataFunction) {
        dataFunction(message->data);
    }
    return message;
}